

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3ColumnMethod(sqlite3_vtab_cursor *pCursor,sqlite3_context *pCtx,int iCol)

{
  sqlite3_vtab *pStmt;
  int iVar1;
  uint uVar2;
  Mem *pMVar3;
  i64 iVar4;
  sqlite3_value *pFrom;
  sqlite3_vtab *psVar5;
  Fts3Cursor *pCsr;
  sqlite3_vtab_cursor *local_30;
  
  psVar5 = pCursor->pVtab;
  iVar1 = *(int *)&psVar5[2].pModule;
  local_30 = pCursor;
  if (iVar1 + 1 == iCol) {
    psVar5 = pCursor[6].pVtab;
  }
  else {
    if (iVar1 == iCol) {
      setResultStrOrError(pCtx,(char *)&local_30,8,'\0',(_func_void_void_ptr *)0xffffffffffffffff);
      return 0;
    }
    if ((iVar1 + 2 == iCol) && (pCursor[3].pVtab != (sqlite3_vtab *)0x0)) {
      psVar5 = (sqlite3_vtab *)(long)*(int *)&pCursor[4].pVtab;
    }
    else {
      iVar1 = fts3CursorSeek((sqlite3_context *)0x0,(Fts3Cursor *)pCursor);
      if (iVar1 != 0) {
        return iVar1;
      }
      if (*(int *)&psVar5[2].pModule + 2 != iCol) {
        psVar5 = pCursor[2].pVtab;
        uVar2 = 0;
        if ((psVar5 != (sqlite3_vtab *)0x0) && (psVar5[1].zErrMsg != (char *)0x0)) {
          uVar2 = (uint)*(ushort *)&psVar5[5].zErrMsg;
        }
        if ((int)uVar2 <= iCol + 1) {
          return 0;
        }
        pFrom = sqlite3_column_value((sqlite3_stmt *)psVar5,iCol + 1);
        sqlite3VdbeMemCopy(pCtx->pOut,pFrom);
        return 0;
      }
      if (psVar5[3].zErrMsg == (char *)0x0) {
        psVar5 = (sqlite3_vtab *)0x0;
      }
      else {
        pStmt = pCursor[2].pVtab;
        pMVar3 = columnMem((sqlite3_stmt *)pStmt,*(int *)&psVar5[2].pModule + 1);
        iVar4 = sqlite3VdbeIntValue(pMVar3);
        columnMallocFailure((sqlite3_stmt *)pStmt);
        psVar5 = (sqlite3_vtab *)(long)(int)iVar4;
      }
    }
  }
  pMVar3 = pCtx->pOut;
  if ((pMVar3->flags & 0x2460) == 0) {
    (pMVar3->u).i = (i64)psVar5;
    pMVar3->flags = 4;
  }
  else {
    vdbeReleaseAndSetInt64(pMVar3,(i64)psVar5);
  }
  return 0;
}

Assistant:

static int fts3ColumnMethod(
  sqlite3_vtab_cursor *pCursor,   /* Cursor to retrieve value from */
  sqlite3_context *pCtx,          /* Context for sqlite3_result_xxx() calls */
  int iCol                        /* Index of column to read value from */
){
  int rc = SQLITE_OK;             /* Return Code */
  Fts3Cursor *pCsr = (Fts3Cursor *) pCursor;
  Fts3Table *p = (Fts3Table *)pCursor->pVtab;

  /* The column value supplied by SQLite must be in range. */
  assert( iCol>=0 && iCol<=p->nColumn+2 );

  if( iCol==p->nColumn+1 ){
    /* This call is a request for the "docid" column. Since "docid" is an 
    ** alias for "rowid", use the xRowid() method to obtain the value.
    */
    sqlite3_result_int64(pCtx, pCsr->iPrevId);
  }else if( iCol==p->nColumn ){
    /* The extra column whose name is the same as the table.
    ** Return a blob which is a pointer to the cursor.  */
    sqlite3_result_blob(pCtx, &pCsr, sizeof(pCsr), SQLITE_TRANSIENT);
  }else if( iCol==p->nColumn+2 && pCsr->pExpr ){
    sqlite3_result_int64(pCtx, pCsr->iLangid);
  }else{
    /* The requested column is either a user column (one that contains 
    ** indexed data), or the language-id column.  */
    rc = fts3CursorSeek(0, pCsr);

    if( rc==SQLITE_OK ){
      if( iCol==p->nColumn+2 ){
        int iLangid = 0;
        if( p->zLanguageid ){
          iLangid = sqlite3_column_int(pCsr->pStmt, p->nColumn+1);
        }
        sqlite3_result_int(pCtx, iLangid);
      }else if( sqlite3_data_count(pCsr->pStmt)>(iCol+1) ){
        sqlite3_result_value(pCtx, sqlite3_column_value(pCsr->pStmt, iCol+1));
      }
    }
  }

  assert( ((Fts3Table *)pCsr->base.pVtab)->pSegments==0 );
  return rc;
}